

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintSExpression::visitImportedFunction(PrintSExpression *this,Function *curr)

{
  Signature sig;
  HeapType local_30;
  undefined4 local_24;
  undefined4 uStack_20;
  undefined4 local_1c;
  Function *local_18;
  Function *curr_local;
  PrintSExpression *this_local;
  
  local_18 = curr;
  curr_local = (Function *)this;
  doIndent(this->o,this->indent);
  this->currFunction = local_18;
  local_24 = 0;
  uStack_20 = 0;
  local_1c = 0;
  (this->lastPrintedLocation).fileIndex = 0;
  (this->lastPrintedLocation).lineNumber = 0;
  (this->lastPrintedLocation).columnNumber = 0;
  std::operator<<(this->o,'(');
  emitImportHeader(this,&local_18->super_Importable);
  sig = Function::getSig(local_18);
  HeapType::HeapType(&local_30,sig);
  handleSignature(this,local_30,
                  (Name)(local_18->super_Importable).super_Named.name.super_IString.str);
  std::operator<<(this->o,')');
  std::operator<<(this->o,this->maybeNewLine);
  return;
}

Assistant:

void visitImportedFunction(Function* curr) {
    doIndent(o, indent);
    currFunction = curr;
    lastPrintedLocation = {0, 0, 0};
    o << '(';
    emitImportHeader(curr);
    handleSignature(curr->getSig(), curr->name);
    o << ')';
    o << maybeNewLine;
  }